

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImTextStrToUtf8(char *out_buf,int out_buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  
  iVar2 = (int)out_buf;
  pcVar4 = out_buf + (long)out_buf_size + -1;
  while( true ) {
    if (((pcVar4 <= out_buf) || (in_text_end != (ImWchar *)0x0 && in_text_end <= in_text)) ||
       (uVar1 = *in_text, uVar1 == 0)) break;
    in_text = in_text + 1;
    if (uVar1 < 0x80) {
      *out_buf = (char)uVar1;
      out_buf = out_buf + 1;
    }
    else {
      uVar3 = ImTextCharToUtf8_inline(out_buf,~(uint)out_buf + iVar2 + out_buf_size,(uint)uVar1);
      out_buf = out_buf + uVar3;
    }
  }
  *out_buf = '\0';
  return (uint)out_buf - iVar2;
}

Assistant:

int ImTextStrToUtf8(char* out_buf, int out_buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_p = out_buf;
    const char* buf_end = out_buf + out_buf_size;
    while (buf_p < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_p++ = (char)c;
        else
            buf_p += ImTextCharToUtf8_inline(buf_p, (int)(buf_end - buf_p - 1), c);
    }
    *buf_p = 0;
    return (int)(buf_p - out_buf);
}